

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O1

Expression * __thiscall
wasm::MultiMemoryLowering::Replacer::makeAddGtuTrap
          (Replacer *this,Expression *leftOperand,Expression *rightOperand,Expression *limit)

{
  BinaryOp BVar1;
  BinaryOp BVar2;
  ulong uVar3;
  Binary *this_00;
  Binary *this_01;
  Expression *pEVar4;
  If *this_02;
  
  uVar3 = (this->parent->pointerType).id;
  if (uVar3 < 7) {
    BVar1 = *(BinaryOp *)(&DAT_00b89c1c + uVar3 * 4);
    BVar2 = *(BinaryOp *)(&DAT_00b89c38 + uVar3 * 4);
    this_00 = (Binary *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x28,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_00->op = BVar2;
    this_00->left = leftOperand;
    this_00->right = rightOperand;
    Binary::finalize(this_00);
    this_01 = (Binary *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x28,8);
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_01->op = BVar1;
    this_01->left = (Expression *)this_00;
    this_01->right = limit;
    Binary::finalize(this_01);
    pEVar4 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x10,8);
    pEVar4->_id = UnreachableId;
    (pEVar4->type).id = 1;
    this_02 = (If *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x28,8);
    (this_02->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
    (this_02->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
    this_02->ifFalse = (Expression *)0x0;
    this_02->condition = (Expression *)this_01;
    this_02->ifTrue = pEVar4;
    If::finalize(this_02);
    return (Expression *)this_02;
  }
  __assert_fail("isBasic() && \"Basic type expected\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                ,0xc6,"BasicType wasm::Type::getBasic() const");
}

Assistant:

Expression* makeAddGtuTrap(Expression* leftOperand,
                               Expression* rightOperand,
                               Expression* limit) {
      Expression* gtuTrap = builder.makeIf(
        builder.makeBinary(
          Abstract::getBinary(parent.pointerType, Abstract::GtU),
          builder.makeBinary(
            Abstract::getBinary(parent.pointerType, Abstract::Add),
            leftOperand,
            rightOperand),
          limit),
        builder.makeUnreachable());
      return gtuTrap;
    }